

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::ArrayWithPreallocation
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *this,
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *other)

{
  bool bVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  ulong local_20;
  size_t i;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *other_local;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *this_local;
  
  this->numActive = 0;
  this->numAllocated = 4;
  bVar1 = isHeapAllocated(other);
  if (bVar1) {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = other->numAllocated;
    resetToInternalStorage(other);
    other->numActive = 0;
  }
  else {
    ppVar2 = getPreallocatedSpace(this);
    this->items = ppVar2;
    this->numActive = other->numActive;
    for (local_20 = 0; local_20 < this->numActive; local_20 = local_20 + 1) {
      this->items[local_20].object = other->items[local_20].object;
    }
  }
  return;
}

Assistant:

ArrayWithPreallocation (ArrayWithPreallocation&& other) noexcept
    {
        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            items = getPreallocatedSpace();
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }
    }